

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

int nk_list_view_begin(nk_context *ctx,nk_list_view *view,char *title,nk_flags flags,int row_height,
                      int row_count)

{
  nk_window *win;
  nk_panel *pnVar1;
  long lVar2;
  nk_hash name;
  int iVar3;
  nk_uint *x_offset;
  nk_uint *y_offset;
  nk_flags value;
  int iVar4;
  long lVar5;
  int iVar6;
  float fVar7;
  float fVar8;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                  ,0x4ffb,
                  "int nk_list_view_begin(struct nk_context *, struct nk_list_view *, const char *, nk_flags, int, int)"
                 );
  }
  if (view == (nk_list_view *)0x0) {
    __assert_fail("view",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                  ,0x4ffc,
                  "int nk_list_view_begin(struct nk_context *, struct nk_list_view *, const char *, nk_flags, int, int)"
                 );
  }
  if (title == (char *)0x0) {
    __assert_fail("title",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                  ,0x4ffd,
                  "int nk_list_view_begin(struct nk_context *, struct nk_list_view *, const char *, nk_flags, int, int)"
                 );
  }
  win = ctx->current;
  if (*title == '\0') {
    lVar5 = 0;
  }
  else {
    lVar5 = 0;
    do {
      lVar2 = lVar5 + 1;
      lVar5 = lVar5 + 1;
    } while (title[lVar2] != '\0');
  }
  fVar7 = (ctx->style).window.spacing.y;
  value = flags;
  name = nk_murmur_hash(title,(int)lVar5,2);
  x_offset = nk_find_value(win,name);
  if (x_offset == (nk_uint *)0x0) {
    x_offset = nk_add_value(ctx,win,name,value);
    y_offset = nk_add_value(ctx,win,name + 1,value);
    *y_offset = 0;
    *x_offset = 0;
  }
  else {
    y_offset = nk_find_value(win,name + 1);
  }
  iVar6 = (int)fVar7;
  if (iVar6 < 1) {
    iVar6 = 0;
  }
  view->scroll_value = *y_offset;
  view->scroll_pointer = y_offset;
  *y_offset = 0;
  iVar3 = nk_group_scrolled_offset_begin(ctx,x_offset,y_offset,title,flags);
  pnVar1 = ctx->current->layout;
  iVar4 = 1;
  if (1 < row_count) {
    iVar4 = row_count;
  }
  view->total_height = iVar4 * (iVar6 + row_height);
  fVar8 = (float)(iVar6 + row_height);
  fVar7 = (float)view->scroll_value / fVar8;
  iVar4 = (int)(float)(~-(uint)(fVar7 <= 0.0) & (uint)fVar7);
  view->begin = iVar4;
  fVar8 = (pnVar1->clip).h / fVar8;
  iVar6 = (int)fVar8 + (uint)(fVar8 < 0.0 && (float)(int)fVar8 < fVar8);
  if (iVar6 < 1) {
    iVar6 = 0;
  }
  view->count = iVar6;
  view->end = iVar6 + iVar4;
  view->ctx = ctx;
  return iVar3;
}

Assistant:

NK_API int
nk_list_view_begin(struct nk_context *ctx, struct nk_list_view *view,
    const char *title, nk_flags flags, int row_height, int row_count)
{
    int title_len;
    nk_hash title_hash;
    nk_uint *x_offset;
    nk_uint *y_offset;

    int result;
    struct nk_window *win;
    struct nk_panel *layout;
    const struct nk_style *style;
    struct nk_vec2 item_spacing;

    NK_ASSERT(ctx);
    NK_ASSERT(view);
    NK_ASSERT(title);
    if (!ctx || !view || !title) return 0;

    win = ctx->current;
    style = &ctx->style;
    item_spacing = style->window.spacing;
    row_height += NK_MAX(0, (int)item_spacing.y);

    /* find persistent list view scrollbar offset */
    title_len = (int)nk_strlen(title);
    title_hash = nk_murmur_hash(title, (int)title_len, NK_PANEL_GROUP);
    x_offset = nk_find_value(win, title_hash);
    if (!x_offset) {
        x_offset = nk_add_value(ctx, win, title_hash, 0);
        y_offset = nk_add_value(ctx, win, title_hash+1, 0);

        NK_ASSERT(x_offset);
        NK_ASSERT(y_offset);
        if (!x_offset || !y_offset) return 0;
        *x_offset = *y_offset = 0;
    } else y_offset = nk_find_value(win, title_hash+1);
    view->scroll_value = *y_offset;
    view->scroll_pointer = y_offset;

    *y_offset = 0;
    result = nk_group_scrolled_offset_begin(ctx, x_offset, y_offset, title, flags);
    win = ctx->current;
    layout = win->layout;
 
    view->total_height = row_height * NK_MAX(row_count,1);
    view->begin = (int)NK_MAX((view->scroll_value / (float)row_height), 0.0f);
    view->count = (int)NK_MAX(nk_iceilf((layout->clip.h)/(float)row_height), 0);
    view->end = view->begin + view->count;
    view->ctx = ctx;
    return result;
}